

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

bool cfgfile::format_t<bool,_cfgfile::string_trait_t>::from_string
               (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  __type _Var1;
  exception_t<cfgfile::string_trait_t> *this;
  bool bVar2;
  allocator local_204;
  allocator local_203;
  allocator local_202;
  allocator local_201;
  string local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )const_t<cfgfile::string_trait_t>::c_on_abi_cxx11_);
  bVar2 = true;
  if (!_Var1) {
    _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)const_t<cfgfile::string_trait_t>::c_true_abi_cxx11_);
    if (!_Var1) {
      _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)const_t<cfgfile::string_trait_t>::c_1_abi_cxx11_);
      if (!_Var1) {
        _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)const_t<cfgfile::string_trait_t>::c_yes_abi_cxx11_);
        if (!_Var1) {
          _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)const_t<cfgfile::string_trait_t>::c_off_abi_cxx11_);
          if (!_Var1) {
            _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)const_t<cfgfile::string_trait_t>::c_false_abi_cxx11_);
            if (!_Var1) {
              _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)const_t<cfgfile::string_trait_t>::c_0_abi_cxx11_);
              if (!_Var1) {
                _Var1 = std::operator==(value,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)const_t<cfgfile::string_trait_t>::c_no_abi_cxx11_);
                if (!_Var1) {
                  this = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
                  std::__cxx11::string::string(local_120,"Invalid value: \"",&local_201);
                  std::__cxx11::string::string((string *)&local_100,local_120);
                  std::operator+(&local_e0,&local_100,value);
                  std::__cxx11::string::string(local_160,"\". In file \"",&local_202);
                  std::__cxx11::string::string((string *)&local_140,local_160);
                  std::operator+(&local_c0,&local_e0,&local_140);
                  std::operator+(&local_a0,&local_c0,&info->m_file_name);
                  std::__cxx11::string::string(local_1a0,"\" on line ",&local_203);
                  std::__cxx11::string::string((string *)&local_180,local_1a0);
                  std::operator+(&local_80,&local_a0,&local_180);
                  std::__cxx11::to_string(&local_1c0,info->m_line_number);
                  std::operator+(&local_60,&local_80,&local_1c0);
                  std::__cxx11::string::string(local_200,".",&local_204);
                  std::__cxx11::string::string((string *)&local_1e0,local_200);
                  std::operator+(&local_40,&local_60,&local_1e0);
                  exception_t<cfgfile::string_trait_t>::exception_t(this,&local_40);
                  __cxa_throw(this,&exception_t<cfgfile::string_trait_t>::typeinfo,
                              exception_t<cfgfile::string_trait_t>::~exception_t);
                }
              }
            }
          }
          bVar2 = false;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

static bool from_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & value )
	{
		if( value == const_t< Trait >::c_on ||
			value == const_t< Trait >::c_true ||
			value == const_t< Trait >::c_1 ||
			value == const_t< Trait >::c_yes )
				return true;
		else if( value == const_t< Trait >::c_off ||
			value == const_t< Trait >::c_false ||
			value == const_t< Trait >::c_0 ||
			value == const_t< Trait >::c_no )
				return false;
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Invalid value: \"" ) +
				value + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}